

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int client_open_proxy(archive_read_filter *self)

{
  int local_14;
  int r;
  archive_read_filter *self_local;
  
  local_14 = 0;
  if ((self->archive->client).opener != (undefined1 *)0x0) {
    local_14 = (*(code *)(self->archive->client).opener)(self->archive,self->data);
  }
  return local_14;
}

Assistant:

static int
client_open_proxy(struct archive_read_filter *self)
{
  int r = ARCHIVE_OK;
	if (self->archive->client.opener != NULL)
		r = (self->archive->client.opener)(
		    (struct archive *)self->archive, self->data);
	return (r);
}